

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

void helper_mpsadbw_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t offset)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  short sVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint64_t uStack_48;
  ZMMReg r;
  
  uVar7 = (ulong)(offset & 3);
  bVar1 = *(byte *)((long)s + uVar7 * 4);
  bVar2 = s->_b_ZMMReg[uVar7 * 4 + 1];
  bVar3 = s->_b_ZMMReg[uVar7 * 4 + 2];
  bVar4 = s->_b_ZMMReg[uVar7 * 4 + 3];
  uVar5 = offset & 4;
  lVar8 = 0;
  do {
    *(undefined2 *)((long)&uStack_48 + lVar8 * 2) = 0;
    iVar9 = (uint)d->_b_ZMMReg[lVar8 + (ulong)uVar5] - (uint)bVar1;
    iVar11 = -iVar9;
    if (0 < iVar9) {
      iVar11 = iVar9;
    }
    *(short *)((long)&uStack_48 + lVar8 * 2) = (short)iVar11;
    iVar10 = (uint)d->_b_ZMMReg[lVar8 + (ulong)uVar5 + 1] - (uint)bVar2;
    iVar9 = -iVar10;
    if (0 < iVar10) {
      iVar9 = iVar10;
    }
    sVar6 = (short)iVar9 + (short)iVar11;
    *(short *)((long)&uStack_48 + lVar8 * 2) = sVar6;
    iVar9 = (uint)d->_b_ZMMReg[lVar8 + (ulong)uVar5 + 2] - (uint)bVar3;
    iVar11 = -iVar9;
    if (0 < iVar9) {
      iVar11 = iVar9;
    }
    sVar6 = (short)iVar11 + sVar6;
    *(short *)((long)&uStack_48 + lVar8 * 2) = sVar6;
    iVar9 = (uint)d->_b_ZMMReg[lVar8 + (ulong)uVar5 + 3] - (uint)bVar4;
    iVar11 = -iVar9;
    if (0 < iVar9) {
      iVar11 = iVar9;
    }
    *(short *)((long)&uStack_48 + lVar8 * 2) = (short)iVar11 + sVar6;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  d->_q_ZMMReg[6] = r._q_ZMMReg[5];
  d->_q_ZMMReg[7] = r._q_ZMMReg[6];
  d->_q_ZMMReg[4] = r._q_ZMMReg[3];
  d->_q_ZMMReg[5] = r._q_ZMMReg[4];
  d->_q_ZMMReg[2] = r._q_ZMMReg[1];
  d->_q_ZMMReg[3] = r._q_ZMMReg[2];
  d->_q_ZMMReg[0] = uStack_48;
  d->_q_ZMMReg[1] = r._q_ZMMReg[0];
  return;
}

Assistant:

void glue(helper_mpsadbw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                  uint32_t offset)
{
    int s0 = (offset & 3) << 2;
    int d0 = (offset & 4) << 0;
    int i;
    Reg r;

    for (i = 0; i < 8; i++, d0++) {
        r.W(i) = 0;
        r.W(i) += abs1(d->B(d0 + 0) - s->B(s0 + 0));
        r.W(i) += abs1(d->B(d0 + 1) - s->B(s0 + 1));
        r.W(i) += abs1(d->B(d0 + 2) - s->B(s0 + 2));
        r.W(i) += abs1(d->B(d0 + 3) - s->B(s0 + 3));
    }

    *d = r;
}